

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

void ecs_colsystem_dtor(ecs_world_t *world,ecs_entity_t component,ecs_entity_t *entities,void *ptr,
                       size_t size,int32_t count,void *ctx)

{
  ecs_entity_t entity;
  _Bool _Var1;
  int32_t iVar2;
  undefined8 *puVar3;
  ulong uVar4;
  
  if (0 < count) {
    puVar3 = (undefined8 *)((long)ptr + 0x20);
    uVar4 = 0;
    do {
      entity = entities[uVar4];
      if (puVar3[-1] != 0) {
        iVar2 = ecs_vector_count(*(ecs_vector_t **)(puVar3[-1] + 0x20));
        if ((iVar2 != 0) && (*(code **)((long)ptr + 0x28) != (code *)0x0)) {
          (**(code **)((long)ptr + 0x28))(world,entity,4,*(undefined8 *)((long)ptr + 0x30));
        }
      }
      _Var1 = ecs_has_entity(world,entity,0x103);
      if (!_Var1) {
        _Var1 = ecs_has_entity(world,entity,0x104);
        if ((!_Var1) && (*(code **)((long)ptr + 0x28) != (code *)0x0)) {
          (**(code **)((long)ptr + 0x28))(world,entity,2,*(undefined8 *)((long)ptr + 0x30));
        }
      }
      (*ecs_os_api.free_)((void *)*puVar3);
      uVar4 = uVar4 + 1;
      puVar3 = puVar3 + 10;
    } while ((uint)count != uVar4);
  }
  return;
}

Assistant:

static
void ecs_colsystem_dtor(
    ecs_world_t *world,
    ecs_entity_t component,
    const ecs_entity_t *entities,
    void *ptr,
    size_t size,
    int32_t count,
    void *ctx)
{
    (void)component;
    (void)ctx;
    (void)size;

    EcsSystem *system_data = ptr;

    int i;
    for (i = 0; i < count; i ++) {
        EcsSystem *cur = &system_data[i];
        ecs_entity_t e = entities[i];

        /* Invoke Deactivated action for active systems */
        if (cur->query && ecs_vector_count(cur->query->tables)) {
            invoke_status_action(world, e, ptr, EcsSystemDeactivated);
        }

        /* Invoke Disabled action for enabled systems */
        if (!ecs_has_entity(world, e, EcsDisabled) && 
            !ecs_has_entity(world, e, EcsDisabledIntern)) 
        {
            invoke_status_action(world, e, ptr, EcsSystemDisabled);
        }           

        ecs_os_free(cur->on_demand);
    }
}